

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralActivity::~IfcStructuralActivity
          (IfcStructuralActivity *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  pvVar2 = *vtt;
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar2 + -0x18))
       = vtt[0x19];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0x1a];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = vtt[0x1c];
  *(void **)&(this->super_IfcProduct).field_0x100 = vtt[0x1d];
  pcVar3 = (this->GlobalOrLocal)._M_dataplus._M_p;
  paVar1 = &(this->GlobalOrLocal).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pvVar2 = vtt[2];
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar2 + -0x18))
       = vtt[0xe];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0xf];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x10];
  puVar5 = *(undefined1 **)
            &(this->super_IfcProduct).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar4 = &(this->super_IfcProduct).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar5 != puVar4) {
    operator_delete(puVar5,*(long *)puVar4 + 1);
  }
  pvVar2 = vtt[4];
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar2 + -0x18))
       = vtt[7];
  puVar5 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x60;
  puVar4 = &(this->super_IfcProduct).super_IfcObject.field_0x70;
  if (puVar5 != puVar4) {
    operator_delete(puVar5,*(long *)puVar4 + 1);
  }
  puVar5 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x38;
  puVar4 = &(this->super_IfcProduct).super_IfcObject.field_0x48;
  if (puVar5 != puVar4) {
    operator_delete(puVar5,*(long *)puVar4 + 1);
  }
  puVar4 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x10;
  puVar5 = &(this->super_IfcProduct).super_IfcObject.field_0x20;
  if (puVar4 != puVar5) {
    operator_delete(puVar4,*(long *)puVar5 + 1);
    return;
  }
  return;
}

Assistant:

IfcStructuralActivity() : Object("IfcStructuralActivity") {}